

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_reserve.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int local_90 [5];
  allocator<char> local_79;
  string local_78;
  Foo local_58;
  undefined1 local_30 [8];
  vector<Foo,_std::allocator<Foo>_> v;
  char **argv_local;
  int argc_local;
  
  v.super__Vector_base<Foo,_std::allocator<Foo>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)argv;
  std::vector<Foo,_std::allocator<Foo>_>::vector((vector<Foo,_std::allocator<Foo>_> *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"hello",&local_79);
  Foo::Foo(&local_58,1,&local_78);
  std::vector<Foo,_std::allocator<Foo>_>::push_back
            ((vector<Foo,_std::allocator<Foo>_> *)local_30,&local_58);
  Foo::~Foo(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  local_90[0] = 3;
  std::vector<Foo,std::allocator<Foo>>::emplace_back<int,char_const(&)[6]>
            ((vector<Foo,std::allocator<Foo>> *)local_30,local_90,(char (*) [6])"world");
  std::vector<Foo,_std::allocator<Foo>_>::~vector((vector<Foo,_std::allocator<Foo>_> *)local_30);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
    vector<Foo> v;
    // v.reserve(2);
    v.push_back(Foo(1, "hello"));

    v.emplace_back(3, "world");

    return 0;
}